

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O2

void __thiscall
wasm::ThreadPool::work
          (ThreadPool *this,
          vector<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
          *doWorkers)

{
  __uniq_ptr_data<wasm::Thread,_std::default_delete<wasm::Thread>,_true,_true> this_00;
  ThreadWorkState TVar1;
  long lVar2;
  long lVar3;
  function<wasm::ThreadWorkState_()> local_70;
  undefined1 local_50 [8];
  unique_lock<std::mutex> lock;
  
  lVar3 = (long)(this->threads).
                super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->threads).
                super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    if ((doWorkers->
        super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (doWorkers->
        super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("doWorkers.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                    ,0xb1,
                    "void wasm::ThreadPool::work(std::vector<std::function<ThreadWorkState ()>> &)")
      ;
    }
    do {
      TVar1 = std::function<wasm::ThreadWorkState_()>::operator()
                        ((doWorkers->
                         super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    } while (TVar1 == More);
  }
  else {
    lVar3 = lVar3 >> 3;
    std::mutex::lock((mutex *)workMutex);
    if ((long)(doWorkers->
              super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(doWorkers->
              super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5 != lVar3) {
      __assert_fail("doWorkers.size() == num",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                    ,0xbc,
                    "void wasm::ThreadPool::work(std::vector<std::function<ThreadWorkState ()>> &)")
      ;
    }
    if (this->running == true) {
      __assert_fail("!running",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                    ,0xbd,
                    "void wasm::ThreadPool::work(std::vector<std::function<ThreadWorkState ()>> &)")
      ;
    }
    this->running = true;
    lock._8_8_ = lVar3;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_50,(mutex_type *)threadMutex);
    resetThreadsAreReady(this);
    lVar3 = 0;
    for (lVar2 = 0; lock._8_8_ != lVar2; lVar2 = lVar2 + 1) {
      this_00.super___uniq_ptr_impl<wasm::Thread,_std::default_delete<wasm::Thread>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Thread_*,_std::default_delete<wasm::Thread>_>.
      super__Head_base<0UL,_wasm::Thread_*,_false>._M_head_impl =
           (this->threads).
           super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar2]._M_t.
           super___uniq_ptr_impl<wasm::Thread,_std::default_delete<wasm::Thread>_>;
      std::function<wasm::ThreadWorkState_()>::function
                (&local_70,
                 (function<wasm::ThreadWorkState_()> *)
                 ((long)&(((doWorkers->
                           super__Vector_base<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                         _M_functor + lVar3));
      Thread::work((Thread *)
                   this_00.super___uniq_ptr_impl<wasm::Thread,_std::default_delete<wasm::Thread>_>.
                   _M_t.super__Tuple_impl<0UL,_wasm::Thread_*,_std::default_delete<wasm::Thread>_>.
                   super__Head_base<0UL,_wasm::Thread_*,_false>._M_head_impl,&local_70);
      std::_Function_base::~_Function_base(&local_70.super__Function_base);
      lVar3 = lVar3 + 0x20;
    }
    while ((this->ready).super___atomic_base<unsigned_long>._M_i !=
           (long)(this->threads).
                 super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->threads).
                 super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) {
      std::condition_variable::wait((unique_lock *)&this->condition);
    }
    this->running = false;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
    pthread_mutex_unlock((pthread_mutex_t *)workMutex);
  }
  return;
}

Assistant:

void ThreadPool::work(
  std::vector<std::function<ThreadWorkState()>>& doWorkers) {
  size_t num = threads.size();
  // If no multiple cores, or on a side thread, do not use worker threads
  if (num == 0) {
    // just run sequentially
    DEBUG_POOL("work() sequentially\n");
    assert(doWorkers.size() > 0);
    while (doWorkers[0]() == ThreadWorkState::More) {
    }
    return;
  }
  // run in parallel on threads
  // TODO: fancy work stealing
  DEBUG_POOL("work() on threads\n");
  // lock globally on doing work in the pool - the threadPool can only be used
  // from one thread at a time, all others must wait patiently
  std::lock_guard<std::mutex> poolLock(workMutex);
  assert(doWorkers.size() == num);
  assert(!running);
  DEBUG_POOL("running = true\n");
  running = true;
  std::unique_lock<std::mutex> lock(threadMutex);
  resetThreadsAreReady();
  for (size_t i = 0; i < num; i++) {
    threads[i]->work(doWorkers[i]);
  }
  DEBUG_POOL("main thread waiting\n");
  condition.wait(lock, [this]() { return areThreadsReady(); });
  DEBUG_POOL("main thread done waiting\n");
  DEBUG_POOL("running = false\n");
  running = false;
  DEBUG_POOL("work() is done\n");
}